

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_memchr.c
# Opt level: O1

int main2(void)

{
  return 0;
}

Assistant:

int main2() {
    const char a[] = "abcda";
    ASSERT_PTR_EQ(memchr(a, ' ', sizeof(a)), NULL);
    ASSERT_PTR_EQ(memchr(a, 'a', sizeof(a)), a);
    ASSERT_PTR_EQ(memchr(a, 'b', sizeof(a)), a + 1);
    ASSERT_PTR_EQ(memchr(a, 'c', sizeof(a)), a + 2);
    ASSERT_PTR_EQ(memchr(a, 'd', sizeof(a)), a + 3);
    return 0;
}